

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExact.c
# Opt level: O2

int ddShuffle(DdManager *table,int *permutation)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  ddTotalNumberSwapping = 0;
  uVar4 = 0;
  uVar3 = (ulong)(uint)table->size;
  if (table->size < 1) {
    uVar3 = uVar4;
  }
  do {
    if (uVar4 == uVar3) {
      return 1;
    }
    lVar2 = (long)table->perm[permutation[uVar4]];
    while ((long)uVar4 < lVar2) {
      iVar1 = cuddSwapInPlace(table,(int)(lVar2 + -1),(int)lVar2);
      lVar2 = lVar2 + -1;
      if (iVar1 == 0) {
        return 0;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static int
ddShuffle(
  DdManager * table,
  DdHalfWord * permutation,
  int  lower,
  int  upper)
{
    DdHalfWord  index;
    int         level;
    int         position;
#if 0
    int         numvars;
#endif
    int         result;
#ifdef DD_STATS
    long        localTime;
    int         initialSize;
#ifdef DD_VERBOSE
    int         finalSize;
#endif
    int         previousSize;
#endif

#ifdef DD_STATS
    localTime = util_cpu_time();
    initialSize = table->keys - table->isolated;
#endif

#if 0
    numvars = table->size;

    (void) fprintf(table->out,"%d:", ddTotalShuffles);
    for (level = 0; level < numvars; level++) {
        (void) fprintf(table->out," %d", table->invperm[level]);
    }
    (void) fprintf(table->out,"\n");
#endif

    for (level = 0; level <= upper - lower; level++) {
        index = permutation[level];
        position = table->perm[index];
#ifdef DD_STATS
        previousSize = table->keys - table->isolated;
#endif
        result = ddSiftUp(table,position,level+lower);
        if (!result) return(0);
    }

#ifdef DD_STATS
    ddTotalShuffles++;
#ifdef DD_VERBOSE
    finalSize = table->keys - table->isolated;
    if (finalSize < initialSize) {
        (void) fprintf(table->out,"-");
    } else if (finalSize > initialSize) {
        (void) fprintf(table->out,"+");
    } else {
        (void) fprintf(table->out,"=");
    }
    if ((ddTotalShuffles & 63) == 0) (void) fprintf(table->out,"\n");
    fflush(table->out);
#endif
#endif

    return(1);

}